

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int Pdr_ManGeneralize(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,Pdr_Set_t **ppCubeMin)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Pdr_Set_t *pPVar6;
  int *local_70;
  int *pOrder;
  abctime clk;
  int RetValue;
  int Lit;
  int n;
  int j;
  int i;
  Pdr_Set_t *pCubeTmp;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t **ppCubeMin_local;
  Pdr_Set_t **ppPred_local;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  *ppCubeMin = (Pdr_Set_t *)0x0;
  iVar2 = Pdr_ManCheckCube(p,k,pCube,ppPred,p->pPars->nConfLimit);
  if (iVar2 == -1) {
    p_local._4_4_ = -1;
  }
  else if (iVar2 == 0) {
    aVar5 = Abc_Clock();
    p->tGeneral = (aVar5 - aVar4) + p->tGeneral;
    p_local._4_4_ = 0;
  }
  else {
    pCubeTmp = Pdr_ManReduceClause(p,k,pCube);
    if (pCubeTmp == (Pdr_Set_t *)0x0) {
      pCubeTmp = Pdr_SetDup(pCube);
    }
    if (p->pPars->fSkipGeneral == 0) {
      local_70 = Pdr_ManSortByPriority(p,pCubeTmp);
      for (Lit = 0; Lit < pCubeTmp->nLits; Lit = Lit + 1) {
        iVar2 = local_70[Lit];
        if (*(int *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) == -1) {
          __assert_fail("pCubeMin->Lits[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                        ,0x154,
                        "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                       );
        }
        iVar3 = Pdr_SetIsInit(pCubeTmp,iVar2);
        if (iVar3 == 0) {
          uVar1 = *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4);
          *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) = 0xffffffff;
          iVar3 = Pdr_ManCheckCube(p,k,pCubeTmp,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
          if (iVar3 == -1) {
            Pdr_SetDeref(pCubeTmp);
            return -1;
          }
          *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) = uVar1;
          if (iVar3 != 0) {
            for (RetValue = Lit; RetValue < pCubeTmp->nLits + -1; RetValue = RetValue + 1) {
              local_70[RetValue] = local_70[RetValue + 1];
            }
            Lit = Lit + -1;
            pPVar6 = Pdr_SetCreateFrom(pCubeTmp,iVar2);
            Pdr_SetDeref(pCubeTmp);
            if (pPVar6->nLits < 1) {
              __assert_fail("pCubeMin->nLits > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                            ,0x16b,
                            "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                           );
            }
            local_70 = Pdr_ManSortByPriority(p,pPVar6);
            pCubeTmp = pPVar6;
          }
        }
      }
      if (p->pPars->fTwoRounds != 0) {
        for (Lit = 0; Lit < pCubeTmp->nLits; Lit = Lit + 1) {
          iVar2 = local_70[Lit];
          if (*(int *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) == -1) {
            __assert_fail("pCubeMin->Lits[i] != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                          ,0x17a,
                          "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                         );
          }
          iVar3 = Pdr_SetIsInit(pCubeTmp,iVar2);
          if (iVar3 == 0) {
            uVar1 = *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4);
            *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) = 0xffffffff;
            iVar3 = Pdr_ManCheckCube(p,k,pCubeTmp,(Pdr_Set_t **)0x0,p->pPars->nConfLimit);
            if (iVar3 == -1) {
              Pdr_SetDeref(pCubeTmp);
              return -1;
            }
            *(undefined4 *)(&pCubeTmp->field_0x14 + (long)iVar2 * 4) = uVar1;
            if (iVar3 != 0) {
              for (RetValue = Lit; RetValue < pCubeTmp->nLits + -1; RetValue = RetValue + 1) {
                local_70[RetValue] = local_70[RetValue + 1];
              }
              Lit = Lit + -1;
              pPVar6 = Pdr_SetCreateFrom(pCubeTmp,iVar2);
              Pdr_SetDeref(pCubeTmp);
              if (pPVar6->nLits < 1) {
                __assert_fail("pCubeMin->nLits > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                              ,0x191,
                              "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                             );
              }
              local_70 = Pdr_ManSortByPriority(p,pPVar6);
              pCubeTmp = pPVar6;
            }
          }
        }
      }
    }
    if (ppCubeMin == (Pdr_Set_t **)0x0) {
      __assert_fail("ppCubeMin != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x199,
                    "int Pdr_ManGeneralize(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, Pdr_Set_t **)"
                   );
    }
    *ppCubeMin = pCubeTmp;
    aVar5 = Abc_Clock();
    p->tGeneral = (aVar5 - aVar4) + p->tGeneral;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Pdr_ManGeneralize( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, Pdr_Set_t ** ppCubeMin )
{
    Pdr_Set_t * pCubeMin, * pCubeTmp = NULL;
    int i, j, n, Lit, RetValue;
    abctime clk = Abc_Clock();
    int * pOrder;
    // if there is no induction, return
    *ppCubeMin = NULL;
    RetValue = Pdr_ManCheckCube( p, k, pCube, ppPred, p->pPars->nConfLimit );
    if ( RetValue == -1 )
        return -1;
    if ( RetValue == 0 )
    {
        p->tGeneral += Abc_Clock() - clk;
        return 0;
    }

    // reduce clause using assumptions
//    pCubeMin = Pdr_SetDup( pCube );
    pCubeMin = Pdr_ManReduceClause( p, k, pCube );
    if ( pCubeMin == NULL )
        pCubeMin = Pdr_SetDup( pCube );

    // perform generalization
    if ( !p->pPars->fSkipGeneral )
    {
        // sort literals by their occurences
        pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        // try removing literals
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }

        if ( p->pPars->fTwoRounds )
        for ( j = 0; j < pCubeMin->nLits; j++ )
        {
            // use ordering
    //        i = j;
            i = pOrder[j];

            // check init state
            assert( pCubeMin->Lits[i] != -1 );
            if ( Pdr_SetIsInit(pCubeMin, i) )
                continue;
            // try removing this literal
            Lit = pCubeMin->Lits[i]; pCubeMin->Lits[i] = -1;
            RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, p->pPars->nConfLimit );
            if ( RetValue == -1 )
            {
                Pdr_SetDeref( pCubeMin );
                return -1;
            }
            pCubeMin->Lits[i] = Lit;
            if ( RetValue == 0 )
                continue;

            // remove j-th entry
            for ( n = j; n < pCubeMin->nLits-1; n++ )
                pOrder[n] = pOrder[n+1];
            j--;

            // success - update the cube
            pCubeMin = Pdr_SetCreateFrom( pCubeTmp = pCubeMin, i );
            Pdr_SetDeref( pCubeTmp );
            assert( pCubeMin->nLits > 0 );
            i--;

            // get the ordering by decreasing priorit
            pOrder = Pdr_ManSortByPriority( p, pCubeMin );
        }
    }

    assert( ppCubeMin != NULL );
    *ppCubeMin = pCubeMin;
    p->tGeneral += Abc_Clock() - clk;
    return 1;
}